

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.h
# Opt level: O0

void set_ref_ptrs(AV1_COMMON *cm,MACROBLOCKD *xd,MV_REFERENCE_FRAME ref0,MV_REFERENCE_FRAME ref1)

{
  char ref_frame;
  scale_factors *psVar1;
  char in_CL;
  long in_RSI;
  AV1_COMMON *in_RDI;
  undefined4 in_stack_ffffffffffffffcc;
  AV1_COMMON *in_stack_ffffffffffffffd0;
  
  psVar1 = get_ref_scale_factors_const
                     (in_stack_ffffffffffffffd0,
                      (MV_REFERENCE_FRAME)((uint)in_stack_ffffffffffffffcc >> 0x18));
  *(scale_factors **)(in_RSI + 0x1f08) = psVar1;
  if (in_CL < '\x01') {
    ref_frame = '\0';
  }
  else {
    ref_frame = in_CL >> 7;
  }
  psVar1 = get_ref_scale_factors_const(in_RDI,ref_frame);
  *(scale_factors **)(in_RSI + 0x1f10) = psVar1;
  return;
}

Assistant:

static inline void set_ref_ptrs(const AV1_COMMON *cm, MACROBLOCKD *xd,
                                MV_REFERENCE_FRAME ref0,
                                MV_REFERENCE_FRAME ref1) {
  xd->block_ref_scale_factors[0] =
      get_ref_scale_factors_const(cm, ref0 >= LAST_FRAME ? ref0 : 1);
  xd->block_ref_scale_factors[1] =
      get_ref_scale_factors_const(cm, ref1 >= LAST_FRAME ? ref1 : 1);
}